

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

state ** State_arrayof(void)

{
  uint uVar1;
  s_x3 *psVar2;
  state **ppsVar3;
  ulong uVar4;
  ulong uVar5;
  
  psVar2 = x3a;
  if (x3a != (s_x3 *)0x0) {
    uVar1 = x3a->count;
    ppsVar3 = (state **)calloc((long)(int)uVar1,8);
    uVar4 = 0;
    if (ppsVar3 != (state **)0x0) {
      uVar5 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar5 = uVar4;
      }
      for (; uVar5 * 8 != uVar4; uVar4 = uVar4 + 8) {
        *(undefined8 *)((long)ppsVar3 + uVar4) =
             *(undefined8 *)((long)&psVar2->tbl->data + uVar4 * 4);
      }
      return ppsVar3;
    }
  }
  return (state **)0x0;
}

Assistant:

struct state **State_arrayof()
{
  struct state **array;
  int i,size;
  if( x3a==0 ) return 0;
  size = x3a->count;
  array = (struct state **)calloc(size, sizeof(struct state *));
  if( array ){
    for(i=0; i<size; i++) array[i] = x3a->tbl[i].data;
  }
  return array;
}